

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmpIO.cpp
# Opt level: O0

double __thiscall AmpIO::GetEncoderClockPeriod(AmpIO *this)

{
  uint32_t uVar1;
  undefined8 local_30;
  uint32_t fver;
  AmpIO *this_local;
  
  uVar1 = BoardIO::GetFirmwareVersion((BoardIO *)this);
  if (uVar1 < 6) {
    this_local = (AmpIO *)0x3eb5d867c3ece2a5;
  }
  else if (uVar1 == 6) {
    this_local = (AmpIO *)0x3e95d867c3ece2a5;
  }
  else {
    uVar1 = BoardIO::GetHardwareVersion((BoardIO *)this);
    local_30 = (AmpIO *)0x3e5ad7f29abcaf48;
    if (uVar1 != 0x64524131) {
      local_30 = (AmpIO *)0x3e55d867c3ece2a5;
    }
    this_local = local_30;
  }
  return (double)this_local;
}

Assistant:

double AmpIO::GetEncoderClockPeriod(void) const
{
    // Could instead return encVelData[0].clkPeriod
    uint32_t fver = GetFirmwareVersion();
    if (fver < 6)
        return VEL_PERD_OLD;
    else if (fver == 6)
        return VEL_PERD_REV6;
    return (GetHardwareVersion() == dRA1_String) ? VEL_PERD_ESPM : VEL_PERD;
}